

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,IfStatement *statement)

{
  NewScopeLayer *pNVar1;
  int iVar2;
  reference pvVar3;
  reference ppNVar4;
  SubtreeWrapper *pSVar5;
  LabelStatement *pLVar6;
  LabelStatement *pLVar7;
  SeqStatement *pSVar8;
  undefined4 extraout_var;
  SeqStatement *this_00;
  JumpStatement *pJVar9;
  StatementWrapper *pSVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Statement *first;
  undefined4 extraout_var_02;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *psVar11;
  Label local_2f8;
  Label local_2d8;
  undefined1 local_2b2;
  undefined1 local_2b1;
  Label local_2b0;
  undefined1 local_28a;
  undefined1 local_289;
  Label local_288;
  undefined1 local_262;
  undefined1 local_261;
  Label local_260;
  Label *local_240;
  Label *result_false_1;
  Label *result_true_1;
  Label local_228;
  LabelStatement *local_208;
  Statement *suffix_1;
  Label label_join_1;
  Label label_false;
  Label label_true_1;
  SubtreeWrapper *false_stmt;
  long local_188;
  size_t index_1;
  SubtreeWrapper *true_stmt_1;
  SubtreeWrapper *local_170;
  SubtreeWrapper *if_expression_1;
  Label local_160;
  Label local_140;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  Label local_118;
  undefined1 local_f1;
  Label local_f0;
  Label *local_d0;
  Label *result_false;
  Label *result_true;
  Label local_b8;
  LabelStatement *local_98;
  Statement *suffix;
  undefined1 local_80 [8];
  Label label_join;
  Label label_true;
  size_t index;
  SubtreeWrapper *true_stmt;
  SubtreeWrapper *local_20;
  SubtreeWrapper *if_expression;
  IfStatement *statement_local;
  IRTreeBuildVisitor *this_local;
  
  if_expression = (SubtreeWrapper *)statement;
  statement_local = (IfStatement *)this;
  if (statement->else_statement_ == (Statement *)0x0) {
    local_20 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &statement->expression_->super_Node);
    pNVar1 = this->current_layer_;
    psVar11 = &this->offsets_;
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    ppNVar4 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                        (&pNVar1->children_,(long)*pvVar3);
    this->current_layer_ = *ppNVar4;
    true_stmt._4_4_ = 0;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (psVar11,(value_type *)((long)&true_stmt + 4));
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        (Node *)if_expression[2]._vptr_SubtreeWrapper);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    iVar2 = *pvVar3;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    label_true.label_.field_2._12_4_ = iVar2 + 1;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (psVar11,(value_type *)(label_true.label_.field_2._M_local_buf + 0xc));
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    IRT::Label::Label((Label *)((long)&label_join.label_.field_2 + 8));
    IRT::Label::Label((Label *)local_80);
    pLVar6 = (LabelStatement *)operator_new(0x28);
    result_true._7_1_ = 1;
    IRT::Label::Label(&local_b8,(Label *)local_80);
    IRT::LabelStatement::LabelStatement(pLVar6,&local_b8);
    result_true._7_1_ = 0;
    IRT::Label::~Label(&local_b8);
    result_false = (Label *)local_80;
    local_d0 = (Label *)local_80;
    local_98 = pLVar6;
    if (pSVar5 != (SubtreeWrapper *)0x0) {
      result_false = (Label *)((long)&label_join.label_.field_2 + 8);
      pLVar6 = (LabelStatement *)operator_new(0x18);
      local_11c = 1;
      pLVar7 = (LabelStatement *)operator_new(0x28);
      local_f1 = 1;
      IRT::Label::Label(&local_f0,(Label *)((long)&label_join.label_.field_2 + 8));
      IRT::LabelStatement::LabelStatement(pLVar7,&local_f0);
      local_f1 = 0;
      pSVar8 = (SeqStatement *)operator_new(0x18);
      local_11b = 1;
      iVar2 = (*pSVar5->_vptr_SubtreeWrapper[3])();
      this_00 = (SeqStatement *)operator_new(0x18);
      local_11a = 1;
      pJVar9 = (JumpStatement *)operator_new(0x28);
      local_119 = 1;
      IRT::Label::Label(&local_118,(Label *)local_80);
      IRT::JumpStatement::JumpStatement(pJVar9,&local_118);
      local_119 = 0;
      IRT::SeqStatement::SeqStatement(this_00,(Statement *)pJVar9,&local_98->super_Statement);
      local_11a = 0;
      IRT::SeqStatement::SeqStatement
                (pSVar8,(Statement *)CONCAT44(extraout_var,iVar2),(Statement *)this_00);
      local_11b = 0;
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar6,(Statement *)pLVar7,(Statement *)pSVar8);
      local_11c = 0;
      local_98 = pLVar6;
      IRT::Label::~Label(&local_118);
      IRT::Label::~Label(&local_f0);
    }
    pSVar10 = (StatementWrapper *)operator_new(0x10);
    if_expression_1._6_1_ = 1;
    pSVar8 = (SeqStatement *)operator_new(0x18);
    pSVar5 = local_20;
    if_expression_1._7_1_ = 1;
    IRT::Label::Label(&local_140,result_false);
    IRT::Label::Label(&local_160,local_d0);
    iVar2 = (*pSVar5->_vptr_SubtreeWrapper[4])(pSVar5,&local_140,&local_160);
    IRT::SeqStatement::SeqStatement
              (pSVar8,(Statement *)CONCAT44(extraout_var_00,iVar2),&local_98->super_Statement);
    if_expression_1._7_1_ = 0;
    IRT::StatementWrapper::StatementWrapper(pSVar10,(Statement *)pSVar8);
    if_expression_1._6_1_ = 0;
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar10;
    IRT::Label::~Label(&local_160);
    IRT::Label::~Label(&local_140);
    IRT::Label::~Label((Label *)local_80);
    IRT::Label::~Label((Label *)((long)&label_join.label_.field_2 + 8));
  }
  else {
    local_170 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                          (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                           &statement->expression_->super_Node);
    pNVar1 = this->current_layer_;
    psVar11 = &this->offsets_;
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    ppNVar4 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                        (&pNVar1->children_,(long)*pvVar3);
    this->current_layer_ = *ppNVar4;
    true_stmt_1._4_4_ = 0;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (psVar11,(value_type *)((long)&true_stmt_1 + 4));
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    index_1 = (size_t)TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                                (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                                 (Node *)if_expression[2]._vptr_SubtreeWrapper);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    local_188 = (long)*pvVar3;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    false_stmt._4_4_ = (int)local_188 + 1;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (psVar11,(value_type *)((long)&false_stmt + 4));
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    pNVar1 = this->current_layer_;
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    ppNVar4 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                        (&pNVar1->children_,(long)*pvVar3);
    this->current_layer_ = *ppNVar4;
    false_stmt._0_4_ = 0;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(psVar11,(value_type *)&false_stmt)
    ;
    IRT::FrameTranslator::SetupScope(this->current_frame_);
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        (Node *)if_expression[3]._vptr_SubtreeWrapper);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(psVar11);
    local_188 = (long)*pvVar3;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(psVar11);
    label_true_1.label_.field_2._12_4_ = (int)local_188 + 1;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              (psVar11,(value_type *)(label_true_1.label_.field_2._M_local_buf + 0xc));
    this->current_layer_ = this->current_layer_->parent_;
    IRT::FrameTranslator::TearDownScope(this->current_frame_);
    IRT::Label::Label((Label *)((long)&label_false.label_.field_2 + 8));
    IRT::Label::Label((Label *)((long)&label_join_1.label_.field_2 + 8));
    IRT::Label::Label((Label *)&suffix_1);
    pLVar6 = (LabelStatement *)operator_new(0x28);
    result_true_1._7_1_ = 1;
    IRT::Label::Label(&local_228,(Label *)&suffix_1);
    IRT::LabelStatement::LabelStatement(pLVar6,&local_228);
    result_true_1._7_1_ = 0;
    IRT::Label::~Label(&local_228);
    result_false_1 = (Label *)&suffix_1;
    local_240 = (Label *)&suffix_1;
    local_208 = pLVar6;
    if (pSVar5 != (SubtreeWrapper *)0x0) {
      local_240 = (Label *)((long)&label_join_1.label_.field_2 + 8);
      pLVar6 = (LabelStatement *)operator_new(0x18);
      local_262 = 1;
      pLVar7 = (LabelStatement *)operator_new(0x28);
      local_261 = 1;
      IRT::Label::Label(&local_260,(Label *)((long)&label_join_1.label_.field_2 + 8));
      IRT::LabelStatement::LabelStatement(pLVar7,&local_260);
      local_261 = 0;
      pSVar8 = (SeqStatement *)operator_new(0x18);
      iVar2 = (*pSVar5->_vptr_SubtreeWrapper[3])();
      IRT::SeqStatement::SeqStatement
                (pSVar8,(Statement *)CONCAT44(extraout_var_01,iVar2),&local_208->super_Statement);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar6,(Statement *)pLVar7,(Statement *)pSVar8);
      local_262 = 0;
      local_208 = pLVar6;
      IRT::Label::~Label(&local_260);
      if (index_1 != 0) {
        pLVar6 = (LabelStatement *)operator_new(0x18);
        local_28a = 1;
        pJVar9 = (JumpStatement *)operator_new(0x28);
        local_289 = 1;
        IRT::Label::Label(&local_288,(Label *)&suffix_1);
        IRT::JumpStatement::JumpStatement(pJVar9,&local_288);
        local_289 = 0;
        IRT::SeqStatement::SeqStatement
                  ((SeqStatement *)pLVar6,(Statement *)pJVar9,&local_208->super_Statement);
        local_28a = 0;
        local_208 = pLVar6;
        IRT::Label::~Label(&local_288);
      }
    }
    if (index_1 != 0) {
      result_false_1 = (Label *)((long)&label_false.label_.field_2 + 8);
      pLVar6 = (LabelStatement *)operator_new(0x18);
      local_2b2 = 1;
      pLVar7 = (LabelStatement *)operator_new(0x28);
      local_2b1 = 1;
      IRT::Label::Label(&local_2b0,(Label *)((long)&label_false.label_.field_2 + 8));
      IRT::LabelStatement::LabelStatement(pLVar7,&local_2b0);
      local_2b1 = 0;
      pSVar8 = (SeqStatement *)operator_new(0x18);
      first = (Statement *)(**(code **)(*(long *)index_1 + 0x18))();
      IRT::SeqStatement::SeqStatement(pSVar8,first,&local_208->super_Statement);
      IRT::SeqStatement::SeqStatement
                ((SeqStatement *)pLVar6,(Statement *)pLVar7,(Statement *)pSVar8);
      local_2b2 = 0;
      local_208 = pLVar6;
      IRT::Label::~Label(&local_2b0);
    }
    pSVar10 = (StatementWrapper *)operator_new(0x10);
    pSVar8 = (SeqStatement *)operator_new(0x18);
    pSVar5 = local_170;
    IRT::Label::Label(&local_2d8,result_false_1);
    IRT::Label::Label(&local_2f8,local_240);
    iVar2 = (*pSVar5->_vptr_SubtreeWrapper[4])(pSVar5,&local_2d8,&local_2f8);
    IRT::SeqStatement::SeqStatement
              (pSVar8,(Statement *)CONCAT44(extraout_var_02,iVar2),&local_208->super_Statement);
    IRT::StatementWrapper::StatementWrapper(pSVar10,(Statement *)pSVar8);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pSVar10;
    IRT::Label::~Label(&local_2f8);
    IRT::Label::~Label(&local_2d8);
    IRT::Label::~Label((Label *)&suffix_1);
    IRT::Label::~Label((Label *)((long)&label_join_1.label_.field_2 + 8));
    IRT::Label::~Label((Label *)((long)&label_false.label_.field_2 + 8));
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(IfStatement* statement) {
  if (statement->else_statement_ == nullptr) {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(
              true_stmt->ToStatement(),
              new IRT::SeqStatement(new IRT::JumpStatement(label_join),
                                    suffix)));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  } else {
    auto if_expression = Accept(statement->expression_);

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto true_stmt = Accept(statement->if_statement_);
    offsets_.pop();
    size_t index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    current_layer_ = current_layer_->children_[offsets_.top()];
    offsets_.push(0);
    current_frame_->SetupScope();
    auto false_stmt = Accept(statement->else_statement_);
    offsets_.pop();
    index = offsets_.top();
    offsets_.pop();
    offsets_.push(index + 1);
    current_layer_ = current_layer_->parent_;
    current_frame_->TearDownScope();

    IRT::Label label_true;
    IRT::Label label_false;
    IRT::Label label_join;

    IRT::Statement* suffix = new IRT::LabelStatement(label_join);

    IRT::Label* result_true = &label_join;
    IRT::Label* result_false = &label_join;

    if (false_stmt) {
      result_false = &label_false;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_false),
          new IRT::SeqStatement(false_stmt->ToStatement(), suffix));

      if (true_stmt) {
        suffix =
            new IRT::SeqStatement(new IRT::JumpStatement(label_join), suffix);
      }
    }

    if (true_stmt) {
      result_true = &label_true;
      suffix = new IRT::SeqStatement(
          new IRT::LabelStatement(label_true),
          new IRT::SeqStatement(true_stmt->ToStatement(), suffix));
    }

    tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
        if_expression->ToConditional(*result_true, *result_false), suffix));
  }
}